

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O2

void P_SetSideNum(side_t **sidenum_p,WORD sidenum)

{
  long lVar1;
  DWORD DVar2;
  undefined6 in_register_00000032;
  
  DVar2 = (DWORD)CONCAT62(in_register_00000032,sidenum);
  if (DVar2 == 0xffff) {
    *sidenum_p = (side_t *)0x0;
    return;
  }
  if (sidecount < numsides) {
    sidetemp[sidecount].field_0.a.map = DVar2;
    lVar1 = (long)sidecount;
    sidecount = sidecount + 1;
    *sidenum_p = sides + lVar1;
    return;
  }
  I_Error("%d sidedefs is not enough\n",(ulong)(uint)sidecount);
  return;
}

Assistant:

static void P_SetSideNum (side_t **sidenum_p, WORD sidenum)
{
	if (sidenum == NO_INDEX)
	{
		*sidenum_p = NULL;
	}
	else if (sidecount < numsides)
	{
		sidetemp[sidecount].a.map = sidenum;
		*sidenum_p = &sides[sidecount++];
	}
	else
	{
		I_Error ("%d sidedefs is not enough\n", sidecount);
	}
}